

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::Func::Call
          (Func *this,Store *store,Values *params,Values *results,Ptr *out_trap,Stream *trace_stream
          )

{
  Enum EVar1;
  Ptr thread;
  Options local_50;
  Ptr local_40;
  
  local_50.value_stack_size = 0x1000;
  local_50.call_stack_size = 0x800;
  local_50.trace_stream = trace_stream;
  Thread::New(&local_40,store,&local_50);
  EVar1 = (*(this->super_Extern).super_Object._vptr_Object[5])
                    (this,local_40.obj_,params,results,out_trap);
  RefPtr<wabt::interp::Thread>::reset(&local_40);
  return (Result)EVar1;
}

Assistant:

Result Func::Call(Store& store,
                  const Values& params,
                  Values& results,
                  Trap::Ptr* out_trap,
                  Stream* trace_stream) {
  Thread::Options options;
  options.trace_stream = trace_stream;
  Thread::Ptr thread = Thread::New(store, options);
  return DoCall(*thread, params, results, out_trap);
}